

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_ghost_spell_power(parser *p)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    plVar1 = *(long **)((long)pvVar3 + 0x18);
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while ((long *)*plVar4 != (long *)0x0);
    uVar2 = parser_getuint(p,"mult");
    *(uint *)((long)plVar4 + 0xc) = uVar2;
    uVar2 = parser_getuint(p,"div");
    *(uint *)(plVar4 + 2) = uVar2;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x7bb,"enum parser_error parse_ghost_spell_power(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_spell_power(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->spell_power.param1 = parser_getuint(p, "mult");
	l->spell_power.param2 = parser_getuint(p, "div");
	return PARSE_ERROR_NONE;
}